

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

void mpack_discard(mpack_reader_t *reader)

{
  anon_union_8_8_6320e492_for_v aVar1;
  size_t count;
  mpack_tag_t mVar2;
  
  mVar2 = mpack_read_tag(reader);
  aVar1 = mVar2.v;
  if (reader->error != mpack_ok) {
    return;
  }
  switch(mVar2.type) {
  case mpack_type_str:
  case mpack_type_bin:
    count = aVar1.u & 0xffffffff;
    goto LAB_001066f9;
  case mpack_type_ext:
    count = aVar1.u >> 0x20;
LAB_001066f9:
    mpack_skip_bytes(reader,count);
    return;
  case mpack_type_array:
    do {
      if (aVar1.l == 0) {
        return;
      }
      mpack_discard(reader);
      aVar1.u = aVar1.u + 0xffffffff;
    } while (reader->error == mpack_ok);
    break;
  case mpack_type_map:
    do {
      if (aVar1.l == 0) {
        return;
      }
      mpack_discard(reader);
      mpack_discard(reader);
      aVar1.u = aVar1.u + 0xffffffff;
    } while (reader->error == mpack_ok);
  }
  return;
}

Assistant:

void mpack_discard(mpack_reader_t* reader) {
    mpack_tag_t var = mpack_read_tag(reader);
    if (mpack_reader_error(reader))
        return;
    switch (var.type) {
        case mpack_type_str:
            mpack_skip_bytes(reader, var.v.l);
            mpack_done_str(reader);
            break;
        case mpack_type_bin:
            mpack_skip_bytes(reader, var.v.l);
            mpack_done_bin(reader);
            break;
        case mpack_type_ext:
            mpack_skip_bytes(reader, var.v.ext.length);
            mpack_done_ext(reader);
            break;
        case mpack_type_array: {
            for (; var.v.n > 0; --var.v.n) {
                mpack_discard(reader);
                if (mpack_reader_error(reader))
                    break;
            }
            mpack_done_array(reader);
            break;
        }
        case mpack_type_map: {
            for (; var.v.n > 0; --var.v.n) {
                mpack_discard(reader);
                mpack_discard(reader);
                if (mpack_reader_error(reader))
                    break;
            }
            mpack_done_map(reader);
            break;
        }
        default:
            break;
    }
}